

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O1

void __thiscall bsplib::Rdma::PushPopCommBuf::deserialize(PushPopCommBuf *this,A2A *a2a)

{
  ostringstream *poVar1;
  pointer pPVar2;
  pointer puVar3;
  unsigned_long uVar4;
  exception *peVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar6;
  long lVar7;
  size_type sVar8;
  long lVar9;
  size_type sVar10;
  int iVar11;
  size_t n;
  size_t size;
  size_t id;
  size_t addr;
  size_type local_200;
  unsigned_long local_1f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1f0;
  A2A *local_1e8;
  PushPopCommBuf *local_1e0;
  Memslot local_1d8;
  exception local_1d0;
  
  if (0 < a2a->m_nprocs) {
    lVar7 = 0;
    pvVar6 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    local_1e8 = a2a;
    local_1e0 = this;
    do {
      iVar11 = (int)lVar7;
      deserial<unsigned_long>(a2a,iVar11,&local_200);
      sVar8 = local_200;
      if (lVar7 == 0) {
        std::
        vector<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
        ::resize(&this->m_pushed_slots,(long)a2a->m_nprocs * local_200);
        pvVar6 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)sVar8;
      }
      else if ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_200 != pvVar6) {
        peVar5 = (exception *)__cxa_allocate_exception(0x1a0);
        exception::exception(&local_1d0,"bsp_push_reg");
        poVar1 = &local_1d0.m_stream;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "Not all processes registered the same number of memory blocks. For example, process 0 registered "
                   ,0x61);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," blocks, while process ",0x17);
        std::ostream::operator<<((ostream *)poVar1,iVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," registerd ",0xb);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        exception::exception(peVar5,&local_1d0);
        __cxa_throw(peVar5,&exception::typeinfo,exception::~exception);
      }
      this = local_1e0;
      a2a = local_1e8;
      if (pvVar6 != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
        sVar8 = 0;
        local_1f0 = pvVar6;
        do {
          deserial<unsigned_long>(a2a,iVar11,(unsigned_long *)&local_1d0);
          deserial<unsigned_long>(a2a,iVar11,&local_1f8);
          deserial<unsigned_long>(a2a,iVar11,&local_1d8);
          lVar9 = (long)a2a->m_nprocs * sVar8;
          pPVar2 = (this->m_pushed_slots).
                   super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pPVar2[lVar9 + lVar7].block.addr = (void *)local_1d0._0_8_;
          pPVar2[lVar9 + lVar7].block.size = local_1f8;
          pPVar2[lVar9 + lVar7].block.status = 0;
          pPVar2[lVar9 + lVar7].slot = local_1d8;
          sVar8 = sVar8 + 1;
          pvVar6 = local_1f0;
        } while (local_1f0 != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)sVar8);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < a2a->m_nprocs);
  }
  if (0 < a2a->m_nprocs) {
    local_1f0 = &this->m_popped_slots;
    iVar11 = 0;
    sVar8 = 0xffffffffffffffff;
    do {
      deserial<unsigned_long>(a2a,iVar11,&local_200);
      sVar10 = local_200;
      if (iVar11 == 0) {
        local_1d0.super_exception = (exception)0xff;
        local_1d0._1_7_ = 0xffffffffffffff;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                  (local_1f0,local_200,(value_type_conflict1 *)&local_1d0);
      }
      else {
        sVar10 = sVar8;
        if (local_200 != sVar8) {
          peVar5 = (exception *)__cxa_allocate_exception(0x1a0);
          exception::exception(&local_1d0,"bsp_pop_reg");
          poVar1 = &local_1d0.m_stream;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,
                     "Not all processes popped the same number of memory blocks. For example, process 0 registered "
                     ,0x5d);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1," blocks, while process ",0x17);
          std::ostream::operator<<((ostream *)poVar1,iVar11);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," registerd ",0xb);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          exception::exception(peVar5,&local_1d0);
          __cxa_throw(peVar5,&exception::typeinfo,exception::~exception);
        }
      }
      if (sVar10 != 0) {
        sVar8 = 0;
        do {
          local_1f8 = 0xffffffffffffffff;
          deserial<unsigned_long>(a2a,iVar11,&local_1f8);
          if (local_1f8 != 0xfffffffffffffffe) {
            if (local_1f8 == 0xffffffffffffffff) {
              __assert_fail("slotid != no_slot()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                            ,0x1cf,"void bsplib::Rdma::PushPopCommBuf::deserialize(A2A &)");
            }
            puVar3 = (this->m_popped_slots).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar4 = puVar3[sVar8];
            if (uVar4 == 0xffffffffffffffff) {
              puVar3[sVar8] = local_1f8;
            }
            else if (uVar4 != local_1f8) {
              peVar5 = (exception *)__cxa_allocate_exception(0x1a0);
              exception::exception(&local_1d0,"bsp_pop_reg");
              poVar1 = &local_1d0.m_stream;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"Processes 0 and ",0x10);
              std::ostream::operator<<((ostream *)poVar1,iVar11);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1," did not pop the same memory registration",0x29);
              exception::exception(peVar5,&local_1d0);
              __cxa_throw(peVar5,&exception::typeinfo,exception::~exception);
            }
          }
          sVar8 = sVar8 + 1;
        } while (sVar10 != sVar8);
      }
      iVar11 = iVar11 + 1;
      sVar8 = sVar10;
    } while (iVar11 < a2a->m_nprocs);
  }
  return;
}

Assistant:

void Rdma::PushPopCommBuf::deserialize( A2A & a2a ) 
{
    size_t n_pushed_slots = 0;

    // read pushed slots
    for (int p = 0; p < a2a.nprocs(); ++p) {
        size_t n;
        deserial( a2a, p, n );

        if ( p == 0 ) {
            n_pushed_slots = n;
            m_pushed_slots.resize( a2a.nprocs() * n );
        } else if (n != n_pushed_slots )
            throw exception("bsp_push_reg") <<
                "Not all processes registered the same number of memory "
                "blocks. For example, process 0 registered " << n_pushed_slots
                << " blocks, while process " << p << " registerd " << n;

        for (size_t s = 0; s < n_pushed_slots; ++s) {
            char * null = NULL;
            size_t addr, size, id;
            deserial( a2a, p, addr);
            deserial( a2a, p, size);
            deserial( a2a, p, id );

            PushEntry entry = { { null + addr, size, Memblock::NORMAL }, id };
            m_pushed_slots[ p + s * a2a.nprocs() ] = entry ;
        }
    }

    // read popped slots
    size_t n_popped_slots = size_t(-1);
    for (int p = 0; p < a2a.nprocs(); ++p) {
        size_t n;
        deserial( a2a, p, n );

        if ( p == 0 ) {
            n_popped_slots = n;
            m_popped_slots.resize( n, no_slot() );
        } else if (n != n_popped_slots )
            throw exception("bsp_pop_reg") <<
                "Not all processes popped the same number of memory "
                "blocks. For example, process 0 registered " << n_popped_slots
                << " blocks, while process " << p << " registerd " << n;

        for (size_t s = 0; s < n_popped_slots; ++s) {
            Memslot slotid = no_slot();
            deserial( a2a, p, slotid );
            assert( slotid != no_slot() );

            if ( slotid != null_slot() ) {
                if ( m_popped_slots[s] == no_slot() ) {
                    m_popped_slots[s] = slotid;
                }
                else {
                    if (m_popped_slots[s] != slotid ) {
                        throw exception("bsp_pop_reg") <<
                            "Processes 0 and " << p << " did not pop "
                            "the same memory registration";
                    }
                }
            }
        }
    }
    
}